

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall graphics101::Mesh::computeNormals(Mesh *this,MeshNormalStrategy strategy)

{
  pointer pvVar1;
  value_type local_18;
  
  pvVar1 = (this->normals).
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->normals).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    (this->normals).
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  }
  local_18.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_18.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_18.field_2.z = 0.0;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(&this->normals,
           ((long)(this->positions).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->positions).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xc,&local_18);
  std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::operator=
            (&this->face_normals,&this->face_positions);
  return;
}

Assistant:

void Mesh::computeNormals( MeshNormalStrategy strategy ) {
    
    // Clear any existing normals.
    normals.clear();
    // Make space for a normal for each position. Initialize them to 0.
    normals.resize( positions.size(), vec3(0,0,0) );
    // Since there is a normal for each position, face_normals should be identical
    // to face_positions.
    face_normals = face_positions;
    
    // Your code goes here.
    
    // Iterate over faces.
    
    // Normalize all normals.
    
}